

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

duplicate_arg * __thiscall
boost::runtime::specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>::
operator<<(duplicate_arg *__return_storage_ptr__,
          specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error> *this,
          char *val)

{
  std::__cxx11::string::append((char *)&(this->super_input_error).super_param_error.msg);
  duplicate_arg::duplicate_arg(__return_storage_ptr__,(duplicate_arg *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }